

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SamplingMode * __thiscall
CoreML::Specification::ResizeBilinearLayerParams::_internal_mutable_mode
          (ResizeBilinearLayerParams *this)

{
  Arena *arena;
  SamplingMode *pSVar1;
  SamplingMode *p;
  ResizeBilinearLayerParams *this_local;
  
  if (this->mode_ == (SamplingMode *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar1 = google::protobuf::MessageLite::CreateMaybeMessage<CoreML::Specification::SamplingMode>
                       (arena);
    this->mode_ = pSVar1;
  }
  return this->mode_;
}

Assistant:

inline ::CoreML::Specification::SamplingMode* ResizeBilinearLayerParams::_internal_mutable_mode() {
  
  if (mode_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::SamplingMode>(GetArenaForAllocation());
    mode_ = p;
  }
  return mode_;
}